

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

parse_error * nlohmann::detail::parse_error::create(int id_,size_t byte_,string *what_arg)

{
  long in_RDX;
  undefined4 in_ESI;
  parse_error *in_RDI;
  string w;
  char *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  parse_error *in_stack_fffffffffffffea0;
  undefined5 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec5;
  byte bVar1;
  exception in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string local_118 [55];
  allocator<char> local_e1;
  string local_e0 [20];
  int in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [40];
  undefined8 local_18;
  undefined4 local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0))));
  exception::name(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::operator+(in_stack_fffffffffffffe98,
                 (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  bVar2 = 0;
  bVar1 = 0;
  if (local_18 == 0) {
    in_stack_fffffffffffffea0 = (parse_error *)&stack0xfffffffffffffec6;
    std::allocator<char>::allocator();
    bVar1 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
               (allocator<char> *)
               CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffec6,
                                       CONCAT15(1,in_stack_fffffffffffffec0))));
  }
  else {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffec8);
    bVar2 = 1;
    std::operator+((char *)in_stack_fffffffffffffe98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  std::operator+(in_stack_fffffffffffffec8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffec6,
                                         CONCAT15(bVar1,in_stack_fffffffffffffec0))));
  std::operator+(in_stack_fffffffffffffe98,
                 (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::operator+(in_stack_fffffffffffffe98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_118);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec6);
  }
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
  }
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::c_str();
  parse_error(in_stack_fffffffffffffea0,local_18._4_4_,CONCAT44(local_c,in_stack_fffffffffffffe90),
              in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

static parse_error create(int id_, std::size_t byte_, const std::string& what_arg)
{
std::string w = exception::name("parse_error", id_) + "parse error" +
(byte_ != 0 ? (" at " + std::to_string(byte_)) : "") +
": " + what_arg;
return parse_error(id_, byte_, w.c_str());
}